

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O0

void __thiscall
Matrix::Matrix(Matrix *this,double *data,shared_array<double> *parent,int *sizes,int dimension)

{
  allocator<char> local_2d;
  int local_2c;
  int *piStack_28;
  int dimension_local;
  int *sizes_local;
  shared_array<double> *parent_local;
  double *data_local;
  Matrix *this_local;
  
  local_2c = dimension;
  piStack_28 = sizes;
  sizes_local = (int *)parent;
  parent_local = (shared_array<double> *)data;
  data_local = (double *)this;
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Matrix_0018f6e8;
  boost::shared_array<double>::shared_array(&this->matrixParent);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->sMatrixName,"reference",&local_2d);
  std::allocator<char>::~allocator(&local_2d);
  this->bReference = true;
  this->pData = (double *)parent_local;
  boost::shared_array<double>::operator=(&this->matrixParent,parent);
  this->pSize = piStack_28;
  this->nMatrixDimension = local_2c;
  init(this,(EVP_PKEY_CTX *)0x0);
  return;
}

Assistant:

Matrix::Matrix(double *data, shared_array<double> parent, int* sizes, int dimension) : sMatrixName("reference")
{
	bReference = true;
	pData = data;
	matrixParent = parent;
	pSize = sizes;
	nMatrixDimension = dimension;
	init(false);
}